

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_draw_list_fill_poly_convex
               (nk_draw_list *list,nk_vec2 *points,uint points_count,nk_color color,
               nk_anti_aliasing aliasing)

{
  undefined4 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  nk_draw_index nVar7;
  nk_colorf color_00;
  nk_colorf color_01;
  nk_colorf color_02;
  void *pvVar8;
  nk_vec2 uv_00;
  nk_draw_index *pnVar9;
  nk_vec2 nVar10;
  uint in_EDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  float fVar11;
  nk_vec2 nVar12;
  nk_draw_index *ids_1;
  void *vtx_1;
  nk_size vtx_count_1;
  nk_size idx_count_1;
  nk_size index_1;
  nk_size i_1;
  float scale;
  float dmr2;
  nk_vec2 dm;
  nk_vec2 n1;
  nk_vec2 n0;
  nk_vec2 uv;
  float len;
  nk_vec2 diff;
  nk_vec2 p1;
  nk_vec2 p0;
  uint vtx_outer_idx;
  uint vtx_inner_idx;
  nk_vec2 *normals;
  nk_size size;
  nk_draw_index *ids;
  void *vtx;
  nk_size vtx_count;
  nk_size idx_count;
  nk_size index;
  nk_size vertex_offset;
  float AA_SIZE;
  nk_size i1;
  nk_size i0;
  nk_size i;
  nk_colorf col_trans;
  nk_colorf col;
  float *in_stack_fffffffffffffe78;
  nk_size in_stack_fffffffffffffe80;
  nk_draw_list *in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe98;
  float in_stack_fffffffffffffe9c;
  undefined4 in_stack_fffffffffffffea0;
  float fVar13;
  undefined4 in_stack_fffffffffffffea4;
  undefined8 in_stack_fffffffffffffea8;
  undefined8 in_stack_fffffffffffffeb0;
  nk_vec2 in_stack_fffffffffffffeb8;
  nk_vec2 in_stack_fffffffffffffec0;
  nk_size in_stack_fffffffffffffed0;
  ulong uVar14;
  nk_size in_stack_fffffffffffffed8;
  undefined8 in_stack_fffffffffffffee0;
  nk_buffer_allocation_type type;
  nk_buffer *in_stack_fffffffffffffee8;
  float fStack_fc;
  float local_f8;
  nk_vec2 local_f0;
  float local_e8;
  float fStack_e4;
  float local_e0;
  float fStack_dc;
  float local_c4;
  float local_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float local_b0;
  float fStack_ac;
  nk_draw_index *local_90;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  
  type = (nk_buffer_allocation_type)((ulong)in_stack_fffffffffffffee0 >> 0x20);
  if ((in_RDI != 0) && (2 < in_EDX)) {
    nk_color_fv(in_stack_fffffffffffffe78,SUB84(in_stack_fffffffffffffe80 >> 0x20,0));
    if (in_R8D == 1) {
      uVar1 = *(undefined4 *)(in_RDI + 0xcc);
      pvVar8 = nk_draw_list_alloc_vertices(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
      local_90 = nk_draw_list_alloc_elements(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
      nVar7 = (nk_draw_index)uVar1;
      sVar6 = nVar7 + 1;
      if ((pvVar8 != (void *)0x0) && (local_90 != (nk_draw_index *)0x0)) {
        nk_buffer_mark(*(nk_buffer **)(in_RDI + 0xb8),NK_BUFFER_FRONT);
        pvVar8 = nk_buffer_alloc(in_stack_fffffffffffffee8,type,in_stack_fffffffffffffed8,
                                 in_stack_fffffffffffffed0);
        if (pvVar8 != (void *)0x0) {
          for (local_48 = 2; local_48 < in_EDX; local_48 = local_48 + 1) {
            *local_90 = nVar7;
            local_90[1] = nVar7 + ((short)local_48 + -1) * 2;
            local_90[2] = nVar7 + (short)local_48 * 2;
            local_90 = local_90 + 3;
          }
          local_50 = (ulong)(in_EDX - 1);
          for (local_58 = 0; local_58 < in_EDX; local_58 = local_58 + 1) {
            uVar2 = *(undefined8 *)(in_RSI + local_50 * 8);
            uVar3 = *(undefined8 *)(in_RSI + local_58 * 8);
            local_b8 = (float)uVar3;
            fStack_b4 = (float)((ulong)uVar3 >> 0x20);
            local_b0 = (float)uVar2;
            fStack_ac = (float)((ulong)uVar2 >> 0x20);
            nVar12 = nk_vec2(local_b8 - local_b0,fStack_b4 - fStack_ac);
            local_c0 = nVar12.x;
            fStack_bc = nVar12.y;
            fVar11 = local_c0 * local_c0 + fStack_bc * fStack_bc;
            if ((fVar11 != 0.0) || (NAN(fVar11))) {
              local_c4 = nk_inv_sqrt((float)(in_stack_fffffffffffffe80 >> 0x20));
            }
            else {
              local_c4 = 1.0;
            }
            nVar12 = nk_vec2(local_c0 * local_c4,fStack_bc * local_c4);
            fStack_bc = nVar12.y;
            *(float *)((long)pvVar8 + local_50 * 8) = fStack_bc;
            local_c0 = nVar12.x;
            *(float *)((long)pvVar8 + local_50 * 8 + 4) = -local_c0;
            local_50 = local_58;
          }
          local_50 = (ulong)(in_EDX - 1);
          for (local_58 = 0; local_58 < in_EDX; local_58 = local_58 + 1) {
            uVar2 = *(undefined8 *)((long)pvVar8 + local_50 * 8);
            uVar3 = *(undefined8 *)((long)pvVar8 + local_58 * 8);
            local_e0 = (float)uVar2;
            fStack_dc = (float)((ulong)uVar2 >> 0x20);
            local_e8 = (float)uVar3;
            fStack_e4 = (float)((ulong)uVar3 >> 0x20);
            nVar12 = nk_vec2(local_e0 + local_e8,fStack_dc + fStack_e4);
            local_f8 = nVar12.x;
            fVar13 = 0.5;
            local_f8 = local_f8 * 0.5;
            nVar12 = nk_vec2(local_e0 + local_e8,fStack_dc + fStack_e4);
            fStack_fc = nVar12.y;
            local_f0 = nk_vec2(local_f8,fStack_fc * fVar13);
            fVar11 = local_f0.x * local_f0.x + local_f0.y * local_f0.y;
            if (1e-06 < fVar11) {
              in_stack_fffffffffffffe9c = 1.0 / fVar11;
              if (100.0 <= in_stack_fffffffffffffe9c) {
                in_stack_fffffffffffffe9c = 100.0;
              }
              local_f0 = nk_vec2(local_f0.x * in_stack_fffffffffffffe9c,
                                 local_f0.y * in_stack_fffffffffffffe9c);
            }
            nVar12 = nk_vec2(local_f0.x * 0.5,local_f0.y * 0.5);
            local_f0.x = nVar12.x;
            local_f0.y = nVar12.y;
            nk_vec2(*(float *)(in_RSI + local_58 * 8) - local_f0.x,
                    *(float *)(in_RSI + 4 + local_58 * 8) - local_f0.y);
            color_00.b = (float)(int)in_stack_fffffffffffffeb0;
            color_00.a = (float)(int)((ulong)in_stack_fffffffffffffeb0 >> 0x20);
            color_00.r = (float)(int)in_stack_fffffffffffffea8;
            color_00.g = (float)(int)((ulong)in_stack_fffffffffffffea8 >> 0x20);
            nk_draw_vertex((void *)CONCAT44(local_f8,fVar13),
                           (nk_convert_config *)
                           CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                           in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,color_00);
            nk_vec2(*(float *)(in_RSI + local_58 * 8) + local_f0.x,
                    *(float *)(in_RSI + 4 + local_58 * 8) + local_f0.y);
            color_01.b = (float)(int)in_stack_fffffffffffffeb0;
            color_01.a = (float)(int)((ulong)in_stack_fffffffffffffeb0 >> 0x20);
            color_01.r = (float)(int)in_stack_fffffffffffffea8;
            color_01.g = (float)(int)((ulong)in_stack_fffffffffffffea8 >> 0x20);
            nk_draw_vertex((void *)CONCAT44(local_f8,fVar13),
                           (nk_convert_config *)
                           CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                           in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,color_01);
            sVar4 = (short)local_58;
            *local_90 = nVar7 + sVar4 * 2;
            sVar5 = (short)local_50;
            local_90[1] = nVar7 + sVar5 * 2;
            local_90[2] = sVar6 + sVar5 * 2;
            local_90[3] = sVar6 + sVar5 * 2;
            local_90[4] = sVar6 + sVar4 * 2;
            local_90[5] = nVar7 + sVar4 * 2;
            local_90 = local_90 + 6;
            local_50 = local_58;
          }
          nk_buffer_reset(*(nk_buffer **)(in_RDI + 0xb8),NK_BUFFER_FRONT);
        }
      }
    }
    else {
      uVar1 = *(undefined4 *)(in_RDI + 0xcc);
      nVar12.x = (in_EDX - 2) * 3;
      nVar12.y = 0.0;
      uv_00.y = 0.0;
      uv_00.x = (float)in_EDX;
      pvVar8 = nk_draw_list_alloc_vertices(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
      pnVar9 = nk_draw_list_alloc_elements(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
      if ((pvVar8 != (void *)0x0) && (pnVar9 != (nk_draw_index *)0x0)) {
        nVar10.x = 0.0;
        nVar10.y = 0.0;
        for (; (ulong)nVar10 < (ulong)uv_00; nVar10 = (nk_vec2)((long)nVar10 + 1)) {
          color_02._8_8_ = pvVar8;
          color_02._0_8_ = pnVar9;
          pvVar8 = nk_draw_vertex((void *)CONCAT44(in_stack_fffffffffffffea4,
                                                   in_stack_fffffffffffffea0),
                                  (nk_convert_config *)
                                  CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                                  nVar12,uv_00,color_02);
        }
        for (uVar14 = 2; uVar14 < in_EDX; uVar14 = uVar14 + 1) {
          nVar7 = (nk_draw_index)uVar1;
          *pnVar9 = nVar7;
          pnVar9[1] = (nVar7 + (short)uVar14) - 1;
          pnVar9[2] = nVar7 + (short)uVar14;
          pnVar9 = pnVar9 + 3;
        }
      }
    }
  }
  return;
}

Assistant:

NK_API void
nk_draw_list_fill_poly_convex(struct nk_draw_list *list,
const struct nk_vec2 *points, const unsigned int points_count,
struct nk_color color, enum nk_anti_aliasing aliasing)
{
struct nk_colorf col;
struct nk_colorf col_trans;

NK_STORAGE const nk_size pnt_align = NK_ALIGNOF(struct nk_vec2);
NK_STORAGE const nk_size pnt_size = sizeof(struct nk_vec2);
NK_ASSERT(list);
if (!list || points_count < 3) return;

#ifdef NK_INCLUDE_COMMAND_USERDATA
nk_draw_list_push_userdata(list, list->userdata);
#endif

color.a = (nk_byte)((float)color.a * list->config.global_alpha);
nk_color_fv(&col.r, color);
col_trans = col;
col_trans.a = 0;

if (aliasing == NK_ANTI_ALIASING_ON) {
nk_size i = 0;
nk_size i0 = 0;
nk_size i1 = 0;

const float AA_SIZE = 1.0f;
nk_size vertex_offset = 0;
nk_size index = list->vertex_count;

const nk_size idx_count = (points_count-2)*3 + points_count*6;
const nk_size vtx_count = (points_count*2);

void *vtx = nk_draw_list_alloc_vertices(list, vtx_count);
nk_draw_index *ids = nk_draw_list_alloc_elements(list, idx_count);

nk_size size = 0;
struct nk_vec2 *normals = 0;
unsigned int vtx_inner_idx = (unsigned int)(index + 0);
unsigned int vtx_outer_idx = (unsigned int)(index + 1);
if (!vtx || !ids) return;

/* temporary allocate normals */
vertex_offset = (nk_size)((nk_byte*)vtx - (nk_byte*)list->vertices->memory.ptr);
nk_buffer_mark(list->vertices, NK_BUFFER_FRONT);
size = pnt_size * points_count;
normals = (struct nk_vec2*) nk_buffer_alloc(list->vertices, NK_BUFFER_FRONT, size, pnt_align);
if (!normals) return;
vtx = (void*)((nk_byte*)list->vertices->memory.ptr + vertex_offset);

/* add elements */
for (i = 2; i < points_count; i++) {
ids[0] = (nk_draw_index)(vtx_inner_idx);
ids[1] = (nk_draw_index)(vtx_inner_idx + ((i-1) << 1));
ids[2] = (nk_draw_index)(vtx_inner_idx + (i << 1));
ids += 3;
}

/* compute normals */
for (i0 = points_count-1, i1 = 0; i1 < points_count; i0 = i1++) {
struct nk_vec2 p0 = points[i0];
struct nk_vec2 p1 = points[i1];
struct nk_vec2 diff = nk_vec2_sub(p1, p0);

/* vec2 inverted length  */
float len = nk_vec2_len_sqr(diff);
if (len != 0.0f)
len = nk_inv_sqrt(len);
else len = 1.0f;
diff = nk_vec2_muls(diff, len);

normals[i0].x = diff.y;
normals[i0].y = -diff.x;
}

/* add vertices + indexes */
for (i0 = points_count-1, i1 = 0; i1 < points_count; i0 = i1++) {
const struct nk_vec2 uv = list->config.null.uv;
struct nk_vec2 n0 = normals[i0];
struct nk_vec2 n1 = normals[i1];
struct nk_vec2 dm = nk_vec2_muls(nk_vec2_add(n0, n1), 0.5f);
float dmr2 = dm.x*dm.x + dm.y*dm.y;
if (dmr2 > 0.000001f) {
float scale = 1.0f / dmr2;
scale = NK_MIN(scale, 100.0f);
dm = nk_vec2_muls(dm, scale);
}
dm = nk_vec2_muls(dm, AA_SIZE * 0.5f);

/* add vertices */
vtx = nk_draw_vertex(vtx, &list->config, nk_vec2_sub(points[i1], dm), uv, col);
vtx = nk_draw_vertex(vtx, &list->config, nk_vec2_add(points[i1], dm), uv, col_trans);

/* add indexes */
ids[0] = (nk_draw_index)(vtx_inner_idx+(i1<<1));
ids[1] = (nk_draw_index)(vtx_inner_idx+(i0<<1));
ids[2] = (nk_draw_index)(vtx_outer_idx+(i0<<1));
ids[3] = (nk_draw_index)(vtx_outer_idx+(i0<<1));
ids[4] = (nk_draw_index)(vtx_outer_idx+(i1<<1));
ids[5] = (nk_draw_index)(vtx_inner_idx+(i1<<1));
ids += 6;
}
/* free temporary normals + points */
nk_buffer_reset(list->vertices, NK_BUFFER_FRONT);
} else {
nk_size i = 0;
nk_size index = list->vertex_count;
const nk_size idx_count = (points_count-2)*3;
const nk_size vtx_count = points_count;
void *vtx = nk_draw_list_alloc_vertices(list, vtx_count);
nk_draw_index *ids = nk_draw_list_alloc_elements(list, idx_count);

if (!vtx || !ids) return;
for (i = 0; i < vtx_count; ++i)
vtx = nk_draw_vertex(vtx, &list->config, points[i], list->config.null.uv, col);
for (i = 2; i < points_count; ++i) {
ids[0] = (nk_draw_index)index;
ids[1] = (nk_draw_index)(index+ i - 1);
ids[2] = (nk_draw_index)(index+i);
ids += 3;
}
}
}